

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O0

int __thiscall SAT::findBackTrackLevel(SAT *this)

{
  Lit p_00;
  int iVar1;
  uint uVar2;
  Lit *pLVar3;
  int *piVar4;
  Lit *pLVar5;
  Engine *this_00;
  long in_RDI;
  int plevel;
  Lit p;
  uint i;
  int max_i;
  int iVar6;
  uint local_18;
  uint local_14;
  int local_4;
  
  uVar2 = vec<Lit>::size((vec<Lit> *)(in_RDI + 0x100));
  if (uVar2 < 2) {
    *(long *)(in_RDI + 0x210) = *(long *)(in_RDI + 0x210) + 1;
    local_4 = 0;
  }
  else {
    local_14 = 1;
    local_18 = 2;
    while( true ) {
      uVar2 = vec<Lit>::size((vec<Lit> *)(in_RDI + 0x100));
      if (uVar2 <= local_18) break;
      pLVar3 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_18);
      uVar2 = ::var((Lit)pLVar3->x);
      piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x70),uVar2);
      iVar6 = *piVar4;
      pLVar3 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_14);
      uVar2 = ::var((Lit)pLVar3->x);
      piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x70),uVar2);
      if (*piVar4 < iVar6) {
        local_14 = local_18;
      }
      local_18 = local_18 + 1;
    }
    pLVar3 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_14);
    p_00.x = pLVar3->x;
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x110),local_14);
    iVar6 = *piVar4;
    pLVar3 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),1);
    pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),local_14);
    pLVar5->x = pLVar3->x;
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x110),1);
    iVar1 = *piVar4;
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x110),local_14);
    *piVar4 = iVar1;
    pLVar3 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x100),1);
    pLVar3->x = p_00.x;
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x110),1);
    *piVar4 = iVar6;
    this_00 = (Engine *)(in_RDI + 0x70);
    uVar2 = ::var(p_00);
    vec<int>::operator[]((vec<int> *)this_00,uVar2);
    local_4 = Engine::tpToLevel(this_00,iVar6);
  }
  return local_4;
}

Assistant:

int SAT::findBackTrackLevel() {
	if (out_learnt.size() < 2) {
		nrestarts++;
		return 0;
	}

	int max_i = 1;
	for (unsigned int i = 2; i < out_learnt.size(); i++) {
		if (trailpos[var(out_learnt[i])] > trailpos[var(out_learnt[max_i])]) {
			max_i = i;
		}
	}
	const Lit p = out_learnt[max_i];
	const int plevel = out_learnt_level[max_i];
	out_learnt[max_i] = out_learnt[1];
	out_learnt_level[max_i] = out_learnt_level[1];
	out_learnt[1] = p;
	out_learnt_level[1] = plevel;

	return engine.tpToLevel(trailpos[var(p)]);
}